

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCompoundCollisionAlgorithm.cpp
# Opt level: O0

btScalar __thiscall
btCompoundCollisionAlgorithm::calculateTimeOfImpact
          (btCompoundCollisionAlgorithm *this,btCollisionObject *body0,btCollisionObject *body1,
          btDispatcherInfo *dispatchInfo,btManifoldResult *resultOut)

{
  int iVar1;
  btTransform *this_00;
  btCollisionAlgorithm **ppbVar2;
  undefined8 in_RCX;
  btCollisionObject *in_RDX;
  btCollisionObject *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  float extraout_XMM0_Da;
  btTransform *childTrans;
  btScalar frac;
  btTransform orgTrans;
  int i;
  int numChildren;
  btScalar hitFraction;
  btCompoundShape *compoundShape;
  btCollisionObject *otherObj;
  btCollisionObject *colObj;
  btCollisionObject *in_stack_ffffffffffffff08;
  btCollisionObject *this_01;
  btCollisionObject *local_e8;
  btTransform *in_stack_ffffffffffffff60;
  int local_4c;
  float local_44;
  
  local_e8 = in_RSI;
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    local_e8 = in_RDX;
  }
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    in_RDX = in_RSI;
  }
  this_01 = in_RDX;
  btCollisionObject::getCollisionShape(local_e8);
  local_44 = 1.0;
  iVar1 = btAlignedObjectArray<btCollisionAlgorithm_*>::size
                    ((btAlignedObjectArray<btCollisionAlgorithm_*> *)(in_RDI + 0x10));
  btTransform::btTransform((btTransform *)this_01);
  for (local_4c = 0; local_4c < iVar1; local_4c = local_4c + 1) {
    btCollisionObject::getWorldTransform(local_e8);
    btTransform::operator=((btTransform *)this_01,(btTransform *)in_stack_ffffffffffffff08);
    this_00 = btCompoundShape::getChildTransform
                        ((btCompoundShape *)this_01,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20))
    ;
    in_stack_ffffffffffffff08 = local_e8;
    btTransform::operator*(this_00,in_stack_ffffffffffffff60);
    btCollisionObject::setWorldTransform(this_01,(btTransform *)in_stack_ffffffffffffff08);
    ppbVar2 = btAlignedObjectArray<btCollisionAlgorithm_*>::operator[]
                        ((btAlignedObjectArray<btCollisionAlgorithm_*> *)(in_RDI + 0x10),local_4c);
    (*(*ppbVar2)->_vptr_btCollisionAlgorithm[3])(*ppbVar2,local_e8,in_RDX,in_RCX,in_R8);
    if (extraout_XMM0_Da < local_44) {
      local_44 = extraout_XMM0_Da;
    }
    btCollisionObject::setWorldTransform(this_01,(btTransform *)in_stack_ffffffffffffff08);
  }
  return local_44;
}

Assistant:

btScalar	btCompoundCollisionAlgorithm::calculateTimeOfImpact(btCollisionObject* body0,btCollisionObject* body1,const btDispatcherInfo& dispatchInfo,btManifoldResult* resultOut)
{
	btAssert(0);
	//needs to be fixed, using btCollisionObjectWrapper and NOT modifying internal data structures
	btCollisionObject* colObj = m_isSwapped? body1 : body0;
	btCollisionObject* otherObj = m_isSwapped? body0 : body1;

	btAssert (colObj->getCollisionShape()->isCompound());
	
	btCompoundShape* compoundShape = static_cast<btCompoundShape*>(colObj->getCollisionShape());

	//We will use the OptimizedBVH, AABB tree to cull potential child-overlaps
	//If both proxies are Compound, we will deal with that directly, by performing sequential/parallel tree traversals
	//given Proxy0 and Proxy1, if both have a tree, Tree0 and Tree1, this means:
	//determine overlapping nodes of Proxy1 using Proxy0 AABB against Tree1
	//then use each overlapping node AABB against Tree0
	//and vise versa.

	btScalar hitFraction = btScalar(1.);

	int numChildren = m_childCollisionAlgorithms.size();
	int i;
    btTransform	orgTrans;
    btScalar frac;
	for (i=0;i<numChildren;i++)
	{
		//btCollisionShape* childShape = compoundShape->getChildShape(i);

		//backup
        orgTrans = colObj->getWorldTransform();
	
		const btTransform& childTrans = compoundShape->getChildTransform(i);
		//btTransform	newChildWorldTrans = orgTrans*childTrans ;
		colObj->setWorldTransform( orgTrans*childTrans );

		//btCollisionShape* tmpShape = colObj->getCollisionShape();
		//colObj->internalSetTemporaryCollisionShape( childShape );
        frac = m_childCollisionAlgorithms[i]->calculateTimeOfImpact(colObj,otherObj,dispatchInfo,resultOut);
		if (frac<hitFraction)
		{
			hitFraction = frac;
		}
		//revert back
		//colObj->internalSetTemporaryCollisionShape( tmpShape);
		colObj->setWorldTransform( orgTrans);
	}
	return hitFraction;

}